

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeprom.c
# Opt level: O0

void write_half_eeprom(int active_dma,gbabus_t *bus,gbamem_t *mem,uint32_t address,uint16_t value)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  gbamem_t *mem_00;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  uint in_EDI;
  ushort in_R8W;
  uint32_t index;
  uint8_t old_value;
  uint8_t eeprom_value;
  uint8_t mask;
  int bit_in_byte;
  int byte_offset;
  int bit;
  int wc;
  uint8_t in_stack_ffffffffffffffaf;
  uint local_24;
  
  if ((*(byte *)(in_RDX + 0x48058) & 1) == 0) {
    mem_00 = (gbamem_t *)(ulong)in_EDI;
    switch(mem_00) {
    case (gbamem_t *)0x0:
      local_24 = (uint)(*(ushort *)(in_RSI + 0x18) & 0x3fff);
      break;
    case (gbamem_t *)0x1:
      local_24 = (uint)(*(ushort *)(in_RSI + 0x38) & 0x3fff);
      break;
    case (gbamem_t *)0x2:
      local_24 = (uint)(*(ushort *)(in_RSI + 0x58) & 0x3fff);
      break;
    case (gbamem_t *)0x3:
      local_24 = (uint)*(ushort *)(in_RSI + 0x78);
    }
    if (local_24 == 9) {
      if ((*(byte *)(in_RDX + 0x48058) & 1) == 0) {
        init_eeprom(mem_00,9);
      }
    }
    else {
      if (local_24 != 0x11) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
                ,0x76);
        fprintf(_stderr,"Write to EEPROM with active DMA %d and a WC of %d\n\x1b[0;m",(ulong)in_EDI,
                (ulong)local_24);
        exit(1);
      }
      if ((*(byte *)(in_RDX + 0x48058) & 1) == 0) {
        init_eeprom(mem_00,0x11);
      }
    }
  }
  switch((gbamem_t *)(ulong)*(uint *)(in_RDX + 0x4804c)) {
  case (gbamem_t *)0x0:
    *(char *)(in_RDX + 0x48050) = (char)((in_R8W & 1) << 1);
    *(undefined4 *)(in_RDX + 0x4804c) = 1;
    break;
  case (gbamem_t *)0x1:
    *(byte *)(in_RDX + 0x48050) = *(byte *)(in_RDX + 0x48050) | (byte)in_R8W & 1;
    handle_eeprom_command((gbamem_t *)(ulong)*(uint *)(in_RDX + 0x4804c),in_stack_ffffffffffffffaf);
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
            ,0xc3);
    fprintf(_stderr,"Write half 0x%04X to EEPROM in unknown state: %d at addr 0x%08X\n\x1b[0;m",
            (ulong)in_R8W,(ulong)*(uint *)(in_RDX + 0x4804c),(ulong)in_ECX);
    exit(1);
  case (gbamem_t *)0x3:
    iVar3 = -*(int *)(in_RDX + 0x48054) + 0x40;
    if (*(int *)(in_RDX + 0x48054) < 1) {
      if (*(int *)(in_RDX + 0x48054) != 0) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
                ,0xbd);
        fprintf(_stderr,"Tried to read from EEPROM when no data was remaining\n\x1b[0;m");
        exit(1);
      }
      if ((in_R8W & 1) != 0) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
                ,0xb7);
        fprintf(_stderr,
                "Expected a write with an LSB of 0 after an EEPROM write stream, instead, got: 0x%04X\n\x1b[0;m"
                ,(ulong)in_R8W);
        exit(1);
      }
      *(undefined4 *)(in_RDX + 0x48054) = 10;
      *(undefined4 *)(in_RDX + 0x4804c) = 4;
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  EEPROM write stream completed.\n\x1b[0;m");
      }
    }
    else {
      uVar4 = iVar3 / 8;
      uVar5 = 7 - iVar3 % 8;
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Transferring %d/64 data bits (byte offset 0x%02X from base address, bit %d)\n\x1b[0;m"
               ,(ulong)(-*(int *)(in_RDX + 0x48054) + 0x41),(ulong)uVar4,(ulong)uVar5);
      }
      bVar1 = *(byte *)(*(long *)(in_RDX + 0x48018) +
                       (long)(int)(*(ushort *)(in_RDX + 0x4805a) + uVar4));
      bVar2 = bVar1 & ((byte)(1 << ((byte)uVar5 & 0x1f)) ^ 0xff) |
              (byte)((in_R8W & 1) << ((byte)uVar5 & 0x1f));
      uVar6 = *(ushort *)(in_RDX + 0x4805a) + uVar4;
      if (*(ulong *)(in_RDX + 0x48010) < (ulong)uVar6) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
                ,0xae);
        fprintf(_stderr,
                "Access to EEPROM outside backup space! Index: %d Backup size: %zu\n\x1b[0;m",
                (ulong)uVar6,*(undefined8 *)(in_RDX + 0x48010));
        exit(1);
      }
      *(byte *)(*(long *)(in_RDX + 0x48018) + (ulong)uVar6) = bVar2;
      *(undefined1 *)(in_RDX + 0x48020) = 1;
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Wrote bit %d to bit number %d in byte offset: %d. Old value: 0x%02X New value: 0x%02X\n\x1b[0;m"
               ,(ulong)(in_R8W & 1),(ulong)uVar5,(ulong)uVar4,(ulong)bVar1,(ulong)bVar2);
      }
    }
    *(int *)(in_RDX + 0x48054) = *(int *)(in_RDX + 0x48054) + -1;
    break;
  case (gbamem_t *)0x5:
    if (*(int *)(in_RDX + 0x48054) < 1) {
      if (((in_R8W & 1) != 0) && (gba_log_verbosity != 0)) {
        printf("\x1b[0;33m[WARN]  Expected a value with an LSB of 0 here, got %d (0x%04X)\n\x1b[0;m"
               ,(ulong)(in_R8W & 1),(ulong)in_R8W);
      }
      *(short *)(in_RDX + 0x4805a) = *(short *)(in_RDX + 0x4805a) << 3;
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Reading 64 bits from EEPROM starting at address: 0x%04X\n\x1b[0;m"
               ,(ulong)*(ushort *)(in_RDX + 0x4805a));
      }
      *(undefined4 *)(in_RDX + 0x4804c) = 2;
      *(undefined4 *)(in_RDX + 0x48054) = 0x44;
    }
    else {
      *(short *)(in_RDX + 0x4805a) = *(short *)(in_RDX + 0x4805a) << 1;
      *(ushort *)(in_RDX + 0x4805a) = *(ushort *)(in_RDX + 0x4805a) | in_R8W & 1;
      *(int *)(in_RDX + 0x48054) = *(int *)(in_RDX + 0x48054) + -1;
    }
    break;
  case (gbamem_t *)0x6:
    if (*(int *)(in_RDX + 0x48054) < 1) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/backup/eeprom.c"
              ,0x9d);
      fprintf(_stderr,"Trying to accept a write address when one is unexpected!\n\x1b[0;m");
      exit(1);
    }
    *(short *)(in_RDX + 0x4805a) = *(short *)(in_RDX + 0x4805a) << 1;
    *(ushort *)(in_RDX + 0x4805a) = *(ushort *)(in_RDX + 0x4805a) | in_R8W & 1;
    iVar3 = *(int *)(in_RDX + 0x48054) + -1;
    *(int *)(in_RDX + 0x48054) = iVar3;
    if (iVar3 == 0) {
      *(short *)(in_RDX + 0x4805a) = *(short *)(in_RDX + 0x4805a) << 3;
      if (gba_log_verbosity != 0) {
        printf("\x1b[0;33m[WARN]  Writing 64 bits to EEPROM starting at address: 0x%04X\n\x1b[0;m",
               (ulong)*(ushort *)(in_RDX + 0x4805a));
      }
      *(undefined4 *)(in_RDX + 0x4804c) = 3;
      *(undefined4 *)(in_RDX + 0x48054) = 0x40;
    }
  }
  return;
}

Assistant:

void write_half_eeprom(int active_dma, gbabus_t* bus, gbamem_t* mem, word address, half value) {
    if (!mem->eeprom_initialized) {
        int wc;
        switch (active_dma) {
            case 0:
                wc = bus->DMA0CNT_L.wc;
                break;
            case 1:
                wc = bus->DMA1CNT_L.wc;
                break;
            case 2:
                wc = bus->DMA2CNT_L.wc;
                break;
            case 3:
                wc = bus->DMA3CNT_L.wc;
                break;
        }

        switch (wc) {
            case 9: // 9 bits = 2 for command, 6 for address, 1 to end command
                if (!mem->eeprom_initialized) {
                    init_eeprom(mem, EEPROM_512);
                }
                break;
            case 17: // 17 bits = 2 for command, 14 for address, 1 to end command
                if (!mem->eeprom_initialized) {
                    init_eeprom(mem, EEPROM_8K);
                }
                break;
            default:
                logfatal("Write to EEPROM with active DMA %d and a WC of %d", active_dma, wc)
        }
    }

    switch (mem->eeprom_state) {
        case EEPROM_READY:
            mem->eeprom_command = (value & 1) << 1;
            mem->eeprom_state = EEPROM_CMD_1;
            break;
        case EEPROM_CMD_1:
            mem->eeprom_command |= (value & 1);
            handle_eeprom_command(mem, mem->eeprom_command);
            break;
        case EEPROM_ACCEPT_READ_ADDRESS:
            if (mem->eeprom_bits_remaining > 0) {
                mem->eeprom_address <<= 1;
                mem->eeprom_address |= (value & 1);
                mem->eeprom_bits_remaining--;
            } else {
                if ((value & 1) != 0) {
                    logwarn("Expected a value with an LSB of 0 here, got %d (0x%04X)", value & 1, value)
                }
                mem->eeprom_address <<= 3; // Addresses are in 8 bit blocks
                logwarn("Reading 64 bits from EEPROM starting at address: 0x%04X", mem->eeprom_address)
                mem->eeprom_state = EEPROM_READ;
                mem->eeprom_bits_remaining = 64 + 4; // Plus 4 garbage bits
            }
            break;
        case EEPROM_ACCEPT_WRITE_ADDRESS:
            if (mem->eeprom_bits_remaining > 0) {
                mem->eeprom_address <<= 1;
                mem->eeprom_address |= (value & 1);
                if (--mem->eeprom_bits_remaining == 0) {
                    mem->eeprom_address <<= 3; // Addresses are in 8-byte blocks
                    logwarn("Writing 64 bits to EEPROM starting at address: 0x%04X", mem->eeprom_address)
                    mem->eeprom_state = EEPROM_WRITE;
                    mem->eeprom_bits_remaining = 64;
                }
            } else {
                logfatal("Trying to accept a write address when one is unexpected!")
            }
            break;
        case EEPROM_WRITE: {
            int bit = 64 - mem->eeprom_bits_remaining;
            if (mem->eeprom_bits_remaining > 0) {
                int byte_offset = bit / 8;
                int bit_in_byte = 7 - (bit % 8); // MSB first
                byte mask = ~(1 << bit_in_byte);
                logwarn("Transferring %d/64 data bits (byte offset 0x%02X from base address, bit %d)", bit + 1,
                        byte_offset, bit_in_byte)
                byte eeprom_value = mem->backup[mem->eeprom_address + byte_offset];
                byte old_value = eeprom_value;
                eeprom_value &= mask;
                eeprom_value |= ((value & 1) << bit_in_byte);
                word index = mem->eeprom_address + byte_offset;
                if (index > mem->backup_size) {
                    logfatal("Access to EEPROM outside backup space! Index: %d Backup size: %zu", index, mem->backup_size)
                }
                mem->backup[index] = eeprom_value;
                mem->backup_dirty = true;
                logwarn("Wrote bit %d to bit number %d in byte offset: %d. Old value: 0x%02X New value: 0x%02X",
                        value & 1, bit_in_byte, byte_offset, old_value, eeprom_value);
            } else if (mem->eeprom_bits_remaining == 0) {
                if ((value & 1) != 0) {
                    logfatal("Expected a write with an LSB of 0 after an EEPROM write stream, instead, got: 0x%04X",
                             value)
                }
                mem->eeprom_bits_remaining = EEPROM_READS_UNTIL_READY;
                mem->eeprom_state = EEPROM_POST_WRITE; // Entire stream has been written
                logwarn("EEPROM write stream completed.")
            } else {
                logfatal("Tried to read from EEPROM when no data was remaining")
            }
            mem->eeprom_bits_remaining--;
            break;
        }
        default:
            logfatal("Write half 0x%04X to EEPROM in unknown state: %d at addr 0x%08X", value, mem->eeprom_state, address)
    }
}